

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecuteTest.h
# Opt level: O2

void UnitTest::
     ExecuteTest<(anonymous_namespace)::XmlTestReporterFixtureOutputIsCachedUntilReportSummaryIsCalledHelper>
               (XmlTestReporterFixtureOutputIsCachedUntilReportSummaryIsCalledHelper *testObject,
               TestDetails *details)

{
  XmlTestReporter *this;
  TestResults *pTVar1;
  char *pcVar2;
  int iVar3;
  TestDetails **ppTVar4;
  TestResults **ppTVar5;
  undefined8 *puVar6;
  TestDetails local_4d0;
  TestDetails details_1;
  SignalTranslator sig;
  
  ppTVar4 = CurrentTest::Details();
  *ppTVar4 = details;
  SignalTranslator::SignalTranslator(&sig);
  iVar3 = __sigsetjmp(SignalTranslator::s_jumpTarget,1);
  if (iVar3 == 0) {
    TestDetails::TestDetails(&details_1,"","","",0);
    this = &(testObject->super_XmlTestReporterFixture).reporter;
    DeferredTestReporter::ReportTestStart(&this->super_DeferredTestReporter,&details_1);
    DeferredTestReporter::ReportFailure(&this->super_DeferredTestReporter,&details_1,"message");
    DeferredTestReporter::ReportTestFinish(&this->super_DeferredTestReporter,&details_1,1.0);
    std::__cxx11::stringbuf::str();
    pcVar2 = local_4d0.testName;
    std::__cxx11::string::~string((string *)&local_4d0);
    if (pcVar2 != (char *)0x0) {
      ppTVar5 = CurrentTest::Results();
      pTVar1 = *ppTVar5;
      ppTVar4 = CurrentTest::Details();
      TestDetails::TestDetails(&local_4d0,*ppTVar4,0x3e);
      TestResults::OnTestFailure(pTVar1,&local_4d0,"output.str().empty()");
    }
    XmlTestReporter::ReportSummary(this,1,1,1,1.0);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::~string((string *)&local_4d0);
    if (local_4d0.testName == (char *)0x0) {
      ppTVar5 = CurrentTest::Results();
      pTVar1 = *ppTVar5;
      ppTVar4 = CurrentTest::Details();
      TestDetails::TestDetails(&local_4d0,*ppTVar4,0x41);
      TestResults::OnTestFailure(pTVar1,&local_4d0,"!output.str().empty()");
    }
    SignalTranslator::~SignalTranslator(&sig);
    return;
  }
  puVar6 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar6 = "Unhandled system exception";
  __cxa_throw(puVar6,&char_const*::typeinfo,0);
}

Assistant:

void ExecuteTest(T& testObject, TestDetails const& details)
{
	CurrentTest::Details() = &details;

	try
	{
#ifdef UNITTEST_POSIX
		UNITTEST_THROW_SIGNALS
#endif
		testObject.RunImpl();
	}
	catch (AssertException const& e)
	{
		CurrentTest::Results()->OnTestFailure(
			TestDetails(details.testName, details.suiteName, e.Filename(), e.LineNumber()), e.what());
	}
	catch (std::exception const& e)
	{
		MemoryOutStream stream;
		stream << "Unhandled exception: " << e.what();
		CurrentTest::Results()->OnTestFailure(details, stream.GetText());
	}
	catch (...)
	{
		CurrentTest::Results()->OnTestFailure(details, "Unhandled exception: Crash!");
	}
}